

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O1

void dlib::cpu::leaky_relu(tensor *dest,tensor *src,float alpha)

{
  float fVar1;
  long lVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  
  iVar5 = (*src->_vptr_tensor[2])(src);
  iVar6 = (*dest->_vptr_tensor[3])(dest);
  lVar2 = dest->m_size;
  if (lVar2 != 0) {
    lVar7 = 0;
    do {
      fVar1 = *(float *)(CONCAT44(extraout_var,iVar5) + lVar7 * 4);
      uVar3 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)fVar1),1);
      bVar4 = (bool)((byte)uVar3 & 1);
      *(uint *)(CONCAT44(extraout_var_00,iVar6) + lVar7 * 4) =
           (uint)bVar4 * (int)fVar1 + (uint)!bVar4 * (int)(fVar1 * alpha);
      lVar7 = lVar7 + 1;
    } while (lVar2 != lVar7);
  }
  return;
}

Assistant:

void leaky_relu (
            tensor& dest,
            const tensor& src,
            const float alpha
        )
        {
            const float* s = src.host();
            float* d = dest.host();
            for (size_t i = 0; i < dest.size(); ++i)
            {
                if (s[i] > 0)
                    d[i] = s[i];
                else
                    d[i] = alpha * s[i];
            }
        }